

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall SugarConvDsk_EDsk_HFE_Test::TestBody(SugarConvDsk_EDsk_HFE_Test *this)

{
  _Alloc_hider in_file_00;
  bool bVar1;
  string local_168;
  path local_148;
  string error_string;
  string filename_to_test;
  string out_file;
  path out_path;
  path in_file;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename_to_test,"Barbarian (1987)(Palace Software)(Disk 1 of 2)[a].dsk",
             (allocator<char> *)&in_file);
  std::experimental::filesystem::v1::__cxx11::path::path(&out_path,&dump_dir_abi_cxx11_);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)&error_string,&filename_to_test);
  std::experimental::filesystem::v1::__cxx11::operator/(&in_file,&out_path,(path *)&error_string);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&error_string);
  std::experimental::filesystem::v1::__cxx11::path::~path(&out_path);
  std::operator+(&out_file,&filename_to_test,".HFE");
  std::experimental::filesystem::v1::__cxx11::path::path((path *)&error_string,&out_dir_abi_cxx11_);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_148,&out_file);
  std::experimental::filesystem::v1::__cxx11::operator/(&out_path,(path *)&error_string,&local_148);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_148);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&error_string);
  error_string._M_dataplus._M_p = (pointer)&error_string.field_2;
  error_string._M_string_length = 0;
  error_string.field_2._M_local_buf[0] = '\0';
  std::experimental::filesystem::v1::__cxx11::path::string(&local_148._M_pathname,&in_file);
  in_file_00._M_p = local_148._M_pathname._M_dataplus._M_p;
  std::experimental::filesystem::v1::__cxx11::path::string(&local_168,&out_path);
  bVar1 = CompareConversion(in_file_00._M_p,local_168._M_dataplus._M_p,"-o=HFE",&error_string);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)&local_148);
    std::operator<<((ostream *)(local_148._M_pathname._M_dataplus._M_p + 0x10),
                    (string *)&error_string);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Tom1975[P]SugarConvDsk/Tests/test.cpp"
               ,0xdd,"Failed");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_148);
  }
  std::__cxx11::string::~string((string *)&error_string);
  std::experimental::filesystem::v1::__cxx11::path::~path(&out_path);
  std::__cxx11::string::~string((string *)&out_file);
  std::experimental::filesystem::v1::__cxx11::path::~path(&in_file);
  std::__cxx11::string::~string((string *)&filename_to_test);
  return;
}

Assistant:

TEST(SugarConvDsk, EDsk_HFE)
{
	const std::string filename_to_test = "Barbarian (1987)(Palace Software)(Disk 1 of 2)[a].dsk";
	const fs::path in_file = fs::path(dump_dir) / filename_to_test;
	std::string out_file = filename_to_test + ".HFE";
	const fs::path out_path = fs::path(out_dir) / out_file;

	std::string error_string;
	if (!CompareConversion(in_file.string().c_str(), out_path.string().c_str(), "-o=HFE", error_string))
	{
		FAIL() << error_string;
	}
}